

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O1

void __thiscall uWS::Group<false>::removeWebSocket(Group<false> *this,uv_poll_t *webSocket)

{
  void *pvVar1;
  _Map_pointer pppuVar2;
  uv_poll_s **ppuVar3;
  uv_poll_t *puVar4;
  uv_poll_s **ppuVar5;
  uv_poll_t **ppuVar6;
  
  pvVar1 = webSocket->data;
  pppuVar2 = (this->iterators).c.super__Deque_base<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node;
  ppuVar5 = (this->iterators).c.super__Deque_base<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>._M_impl
            .super__Deque_impl_data._M_finish._M_cur;
  ppuVar3 = (this->iterators).c.super__Deque_base<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>._M_impl
            .super__Deque_impl_data._M_finish._M_first;
  if (((long)(this->iterators).c.super__Deque_base<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>.
             _M_impl.super__Deque_impl_data._M_start._M_last -
       (long)(this->iterators).c.super__Deque_base<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
      ((long)ppuVar5 - (long)ppuVar3 >> 3) +
      ((((ulong)((long)pppuVar2 -
                (long)(this->iterators).c.
                      super__Deque_base<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (ulong)(pppuVar2 == (_Map_pointer)0x0)) * 0x40 != 0) {
    if (ppuVar5 == ppuVar3) {
      ppuVar5 = pppuVar2[-1] + 0x40;
    }
    ppuVar5[-1] = *(uv_poll_s **)((long)pvVar1 + 0x30);
  }
  puVar4 = *(uv_poll_t **)((long)pvVar1 + 0x38);
  if (puVar4 != *(uv_poll_t **)((long)pvVar1 + 0x30)) {
    if (puVar4 == (uv_poll_t *)0x0) {
      ppuVar6 = &this->webSocketHead;
    }
    else {
      ppuVar6 = (uv_poll_t **)((long)puVar4->data + 0x30);
    }
    *ppuVar6 = *(uv_poll_t **)((long)pvVar1 + 0x30);
    if (*(long **)((long)pvVar1 + 0x30) != (long *)0x0) {
      *(uv_poll_t **)(**(long **)((long)pvVar1 + 0x30) + 0x38) = puVar4;
    }
    return;
  }
  this->webSocketHead = (uv_poll_t *)0x0;
  return;
}

Assistant:

void Group<isServer>::removeWebSocket(uv_poll_t *webSocket) {
    uS::SocketData *socketData = (uS::SocketData *) webSocket->data;
    if (iterators.size()) {
        iterators.top() = socketData->next;
    }
    if (socketData->prev == socketData->next) {
        webSocketHead = (uv_poll_t *) nullptr;
    } else {
        if (socketData->prev) {
            ((uS::SocketData *) socketData->prev->data)->next = socketData->next;
        } else {
            webSocketHead = socketData->next;
        }
        if (socketData->next) {
            ((uS::SocketData *) socketData->next->data)->prev = socketData->prev;
        }
    }
}